

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void kill_monster_on_level(int mndx)

{
  monst *pmVar1;
  int iVar2;
  monst *mtmp;
  
  pmVar1 = level->monlist;
  while (mtmp = pmVar1, mtmp != (monst *)0x0) {
    pmVar1 = mtmp->nmon;
    if (0 < mtmp->mhp) {
      if (mtmp->mnum == mndx) {
        mondead(mtmp);
      }
      else if ((mtmp->field_0x60 & 0x70) != 0) {
        iVar2 = monsndx(mtmp->data);
        if (iVar2 == mndx) {
          newcham(level,mtmp,(permonst *)0x0,'\0','\0');
        }
      }
    }
  }
  return;
}

Assistant:

void kill_monster_on_level(int mndx)
{
	struct monst *mtmp;
	struct monst *mtmp2;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;
	    if (DEADMONSTER(mtmp)) continue;
	    /*
	     * Level genociding a chameleon kills it,
	     * while level genociding its form just makes it change form.
	     */
	    if (mtmp->mnum == mndx)
		mondead(mtmp);
	    else if (mtmp->cham && monsndx(mtmp->data) == mndx)
		newcham(level, mtmp, NULL, FALSE, FALSE);
	}
}